

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_get_name(coda_type *type,char **name)

{
  char **name_local;
  coda_type *type_local;
  
  if (type == (coda_type *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0xbb5);
    type_local._4_4_ = -1;
  }
  else if (name == (char **)0x0) {
    coda_set_error(-100,"name argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0xbba);
    type_local._4_4_ = -1;
  }
  else {
    *name = type->name;
    type_local._4_4_ = 0;
  }
  return type_local._4_4_;
}

Assistant:

LIBCODA_API int coda_type_get_name(const coda_type *type, const char **name)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (name == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "name argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    *name = type->name;
    return 0;
}